

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBLumaColorTableRow_SSSE3
               (uint8_t *src_argb,uint8_t *dst_argb,int width,uint8_t *luma,uint32_t lumacoeff)

{
  bool bVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  uint uVar4;
  undefined1 auVar5 [14];
  int iVar6;
  ushort uVar7;
  undefined1 auVar8 [14];
  uint uVar10;
  uint uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int width_local;
  
  auVar12._4_4_ = lumacoeff;
  auVar12._0_4_ = lumacoeff;
  auVar12._8_4_ = lumacoeff;
  auVar12._12_4_ = lumacoeff;
  auVar13[8] = 0xff;
  auVar13._0_8_ = 0xffffffffffffffff;
  auVar13[9] = 0xff;
  auVar13[10] = 0xff;
  auVar13[0xb] = 0xff;
  auVar13[0xc] = 0xff;
  auVar13[0xd] = 0xff;
  auVar13[0xe] = 0xff;
  auVar13[0xf] = 0xff;
  auVar13 = psllw(auVar13,8);
  do {
    auVar9 = pmaddubsw(*(undefined1 (*) [16])src_argb,auVar12);
    auVar9 = phaddw(auVar9,auVar9);
    auVar8 = auVar9._0_14_ & auVar13._0_14_;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar8._0_10_;
    auVar2._12_2_ = auVar8._6_2_;
    auVar3._8_2_ = auVar8._4_2_;
    auVar3._0_8_ = auVar8._0_8_;
    auVar3._10_4_ = auVar2._10_4_;
    auVar5._6_8_ = 0;
    auVar5._0_6_ = auVar3._8_6_;
    uVar7 = auVar8._0_2_;
    uVar10 = (uint)CONCAT82(SUB148(auVar5 << 0x40,6),auVar8._2_2_);
    uVar11 = auVar3._8_4_;
    uVar4 = auVar2._10_4_ >> 0x10;
    *dst_argb = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[0] + (ulong)uVar7];
    dst_argb[1] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[1] + (ulong)uVar7];
    dst_argb[2] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[2] + (ulong)uVar7];
    dst_argb[3] = (*(undefined1 (*) [16])src_argb)[3];
    dst_argb[4] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[4] + (ulong)uVar10];
    dst_argb[5] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[5] + (ulong)uVar10];
    dst_argb[6] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[6] + (ulong)uVar10];
    dst_argb[7] = (*(undefined1 (*) [16])src_argb)[7];
    dst_argb[8] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[8] + (ulong)uVar11];
    dst_argb[9] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[9] + (ulong)uVar11];
    dst_argb[10] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[10] + (ulong)uVar11];
    dst_argb[0xb] = (*(undefined1 (*) [16])src_argb)[0xb];
    dst_argb[0xc] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[0xc] + (ulong)uVar4];
    dst_argb[0xd] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[0xd] + (ulong)uVar4];
    dst_argb[0xe] = luma[(ulong)(byte)(*(undefined1 (*) [16])src_argb)[0xe] + (ulong)uVar4];
    dst_argb[0xf] = (*(undefined1 (*) [16])src_argb)[0xf];
    src_argb = (uint8_t *)((long)src_argb + 0x10);
    dst_argb = dst_argb + 0x10;
    iVar6 = width + -4;
    bVar1 = 3 < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar1);
  return;
}

Assistant:

void ARGBLumaColorTableRow_SSSE3(const uint8_t* src_argb,
                                 uint8_t* dst_argb,
                                 int width,
                                 const uint8_t* luma,
                                 uint32_t lumacoeff) {
  uintptr_t pixel_temp;
  uintptr_t table_temp;
  asm volatile(
      "movd        %6,%%xmm3                     \n"
      "pshufd      $0x0,%%xmm3,%%xmm3            \n"
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psllw       $0x8,%%xmm4                   \n"
      "pxor        %%xmm5,%%xmm5                 \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%2),%%xmm0                   \n"
      "pmaddubsw   %%xmm3,%%xmm0                 \n"
      "phaddw      %%xmm0,%%xmm0                 \n"
      "pand        %%xmm4,%%xmm0                 \n"
      "punpcklwd   %%xmm5,%%xmm0                 \n"
      "movd        %%xmm0,%k1                    \n"  // 32 bit offset
      "add         %5,%1                         \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"

      "movzb       (%2),%0                       \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,(%3)                      \n"
      "movzb       0x1(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x1(%3)                   \n"
      "movzb       0x2(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x2(%3)                   \n"
      "movzb       0x3(%2),%0                    \n"
      "mov         %b0,0x3(%3)                   \n"

      "movd        %%xmm0,%k1                    \n"  // 32 bit offset
      "add         %5,%1                         \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"

      "movzb       0x4(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x4(%3)                   \n"
      "movzb       0x5(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x5(%3)                   \n"
      "movzb       0x6(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x6(%3)                   \n"
      "movzb       0x7(%2),%0                    \n"
      "mov         %b0,0x7(%3)                   \n"

      "movd        %%xmm0,%k1                    \n"  // 32 bit offset
      "add         %5,%1                         \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"

      "movzb       0x8(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x8(%3)                   \n"
      "movzb       0x9(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0x9(%3)                   \n"
      "movzb       0xa(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0xa(%3)                   \n"
      "movzb       0xb(%2),%0                    \n"
      "mov         %b0,0xb(%3)                   \n"

      "movd        %%xmm0,%k1                    \n"  // 32 bit offset
      "add         %5,%1                         \n"

      "movzb       0xc(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0xc(%3)                   \n"
      "movzb       0xd(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0xd(%3)                   \n"
      "movzb       0xe(%2),%0                    \n"
      "movzb       0x00(%1,%0,1),%0              \n"
      "mov         %b0,0xe(%3)                   \n"
      "movzb       0xf(%2),%0                    \n"
      "mov         %b0,0xf(%3)                   \n"
      "lea         0x10(%2),%2                   \n"
      "lea         0x10(%3),%3                   \n"
      "sub         $0x4,%4                       \n"
      "jg          1b                            \n"
      : "=&d"(pixel_temp),  // %0
        "=&a"(table_temp),  // %1
        "+r"(src_argb),     // %2
        "+r"(dst_argb),     // %3
        "+rm"(width)        // %4
      : "r"(luma),          // %5
        "rm"(lumacoeff)     // %6
      : "memory", "cc", "xmm0", "xmm3", "xmm4", "xmm5");
}